

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::IndirectBuffer::ReadImplementation::recordCommands
          (ReadImplementation *this,VkCommandBuffer cmdBuffer)

{
  OperationContext *pOVar1;
  DeviceInterface *pDVar2;
  Pipeline *pPVar3;
  Handle<(vk::HandleType)22> *pHVar4;
  Buffer *this_00;
  VkBuffer *pVVar5;
  undefined1 local_60 [8];
  VkBufferMemoryBarrier barrier;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  ReadImplementation *this_local;
  
  pDVar2 = OperationContext::getDeviceInterface(this->m_context);
  pPVar3 = de::details::
           UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
           ::operator->(&(this->m_pipeline).
                         super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
                       );
  pOVar1 = this->m_context;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  barrier.size = pHVar4->m_internal;
  (*pPVar3->_vptr_Pipeline[2])(pPVar3,pOVar1,cmdBuffer,barrier.size);
  this_00 = de::details::
            UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
            ::operator*(&(this->m_hostBuffer).
                         super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                       );
  pVVar5 = synchronization::Buffer::operator*(this_00);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_60,0x40,0x2000,(VkBuffer)pVVar5->m_internal,0,
             this->m_hostBufferSizeBytes);
  (*pDVar2->_vptr_DeviceInterface[0x6d])
            (pDVar2,cmdBuffer,(ulong)this->m_pipelineStage,0x4000,0,0,0,1,local_60,0,0);
  return;
}

Assistant:

void recordCommands (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk	= m_context.getDeviceInterface();

		m_pipeline->recordCommands(m_context, cmdBuffer, *m_descriptorSet);

		// Insert a barrier so data written by the shader is available to the host
		const VkBufferMemoryBarrier	barrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **m_hostBuffer, 0u, m_hostBufferSizeBytes);
		vk.cmdPipelineBarrier(cmdBuffer, m_pipelineStage, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
	}